

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019df20 = 0x2d2d2d2d2d2d2d;
    uRam000000000019df27._0_1_ = '-';
    uRam000000000019df27._1_1_ = '-';
    uRam000000000019df27._2_1_ = '-';
    uRam000000000019df27._3_1_ = '-';
    uRam000000000019df27._4_1_ = '-';
    uRam000000000019df27._5_1_ = '-';
    uRam000000000019df27._6_1_ = '-';
    uRam000000000019df27._7_1_ = '-';
    DAT_0019df10 = '-';
    DAT_0019df10_1._0_1_ = '-';
    DAT_0019df10_1._1_1_ = '-';
    DAT_0019df10_1._2_1_ = '-';
    DAT_0019df10_1._3_1_ = '-';
    DAT_0019df10_1._4_1_ = '-';
    DAT_0019df10_1._5_1_ = '-';
    DAT_0019df10_1._6_1_ = '-';
    uRam000000000019df18 = 0x2d2d2d2d2d2d2d;
    DAT_0019df1f = 0x2d;
    DAT_0019df00 = '-';
    DAT_0019df00_1._0_1_ = '-';
    DAT_0019df00_1._1_1_ = '-';
    DAT_0019df00_1._2_1_ = '-';
    DAT_0019df00_1._3_1_ = '-';
    DAT_0019df00_1._4_1_ = '-';
    DAT_0019df00_1._5_1_ = '-';
    DAT_0019df00_1._6_1_ = '-';
    uRam000000000019df08._0_1_ = '-';
    uRam000000000019df08._1_1_ = '-';
    uRam000000000019df08._2_1_ = '-';
    uRam000000000019df08._3_1_ = '-';
    uRam000000000019df08._4_1_ = '-';
    uRam000000000019df08._5_1_ = '-';
    uRam000000000019df08._6_1_ = '-';
    uRam000000000019df08._7_1_ = '-';
    DAT_0019def0 = '-';
    DAT_0019def0_1._0_1_ = '-';
    DAT_0019def0_1._1_1_ = '-';
    DAT_0019def0_1._2_1_ = '-';
    DAT_0019def0_1._3_1_ = '-';
    DAT_0019def0_1._4_1_ = '-';
    DAT_0019def0_1._5_1_ = '-';
    DAT_0019def0_1._6_1_ = '-';
    uRam000000000019def8._0_1_ = '-';
    uRam000000000019def8._1_1_ = '-';
    uRam000000000019def8._2_1_ = '-';
    uRam000000000019def8._3_1_ = '-';
    uRam000000000019def8._4_1_ = '-';
    uRam000000000019def8._5_1_ = '-';
    uRam000000000019def8._6_1_ = '-';
    uRam000000000019def8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019dee8._0_1_ = '-';
    uRam000000000019dee8._1_1_ = '-';
    uRam000000000019dee8._2_1_ = '-';
    uRam000000000019dee8._3_1_ = '-';
    uRam000000000019dee8._4_1_ = '-';
    uRam000000000019dee8._5_1_ = '-';
    uRam000000000019dee8._6_1_ = '-';
    uRam000000000019dee8._7_1_ = '-';
    DAT_0019df2f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}